

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.c
# Opt level: O1

bool_t prf_material_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint32_t *puVar1;
  uint uVar2;
  uint len;
  bool_t bVar3;
  
  if (node->opcode == prf_material_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar2 = 4;
    if (7 < node->length) {
      puVar1 = (uint32_t *)node->data;
      bf_put_uint32_be(bfile,*puVar1);
      uVar2 = 8;
      if (0x13 < node->length) {
        bf_write(bfile,(uint8_t *)(puVar1 + 1),0xc);
        uVar2 = 0x14;
        if (0x17 < node->length) {
          bf_put_uint32_be(bfile,puVar1[4]);
          uVar2 = 0x18;
          if (0x1b < node->length) {
            bf_put_float32_be(bfile,(float32_t)puVar1[5]);
            uVar2 = 0x1c;
            if (0x1f < node->length) {
              bf_put_float32_be(bfile,(float32_t)puVar1[6]);
              uVar2 = 0x20;
              if (0x23 < node->length) {
                bf_put_float32_be(bfile,(float32_t)puVar1[7]);
                uVar2 = 0x24;
                if (0x27 < node->length) {
                  bf_put_float32_be(bfile,(float32_t)puVar1[8]);
                  uVar2 = 0x28;
                  if (0x2b < node->length) {
                    bf_put_float32_be(bfile,(float32_t)puVar1[9]);
                    uVar2 = 0x2c;
                    if (0x2f < node->length) {
                      bf_put_float32_be(bfile,(float32_t)puVar1[10]);
                      uVar2 = 0x30;
                      if (0x33 < node->length) {
                        bf_put_float32_be(bfile,(float32_t)puVar1[0xb]);
                        uVar2 = 0x34;
                        if (0x37 < node->length) {
                          bf_put_float32_be(bfile,(float32_t)puVar1[0xc]);
                          uVar2 = 0x38;
                          if (0x3b < node->length) {
                            bf_put_float32_be(bfile,(float32_t)puVar1[0xd]);
                            uVar2 = 0x3c;
                            if (0x3f < node->length) {
                              bf_put_float32_be(bfile,(float32_t)puVar1[0xe]);
                              uVar2 = 0x40;
                              if (0x43 < node->length) {
                                bf_put_float32_be(bfile,(float32_t)puVar1[0xf]);
                                uVar2 = 0x44;
                                if (0x47 < node->length) {
                                  bf_put_float32_be(bfile,(float32_t)puVar1[0x10]);
                                  uVar2 = 0x48;
                                  if (0x4b < node->length) {
                                    bf_put_float32_be(bfile,(float32_t)puVar1[0x11]);
                                    uVar2 = 0x4c;
                                    if (0x4f < node->length) {
                                      bf_put_float32_be(bfile,(float32_t)puVar1[0x12]);
                                      uVar2 = 0x50;
                                      if (0x53 < node->length) {
                                        bf_put_uint32_be(bfile,puVar1[0x13]);
                                        uVar2 = 0x54;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar3 = 1;
    len = node->length - uVar2;
    if (uVar2 <= node->length && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar2 - 4),len);
    }
  }
  else {
    bVar3 = 0;
    prf_error(9,"tried using material save method for node of type %d.");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_material_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_material_info.opcode ) {
        prf_error( 9, "tried using material save method for node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->material_index ); pos += 4;
        if ( node->length < (pos + 12) ) break;
        bf_write( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->shininess ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->alpha ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->spare ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}